

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# track-heuristic-partition-matching.cxx
# Opt level: O2

int main(int argc,char **argv)

{
  string *fileNamePrefix;
  int iVar1;
  int iVar2;
  runtime_error *this;
  size_t in_R9;
  Edge *e;
  pointer pEVar3;
  value_type_conflict2 vVar4;
  value_type_conflict2 vVar5;
  Solution solution;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  string local_240 [32];
  Problem problem;
  NegativeLogProbabilityRatio<double> local_1d8;
  Parameters parameters;
  SolutionGraph solutionGraph;
  ProblemGraph problemGraph;
  
  parseCommandLine(&parameters,argc,argv);
  lineage::loadProblem(&problem,&parameters.nodesFileName,&parameters.edgesFileName);
  local_1d8.epsilon_ = 0.00392156862745098;
  local_1d8.oneMinusEpsilon_ = 0.996078431372549;
  for (pEVar3 = problem.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar3 != problem.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>.
                _M_impl.super__Vector_impl_data._M_finish; pEVar3 = pEVar3 + 1) {
    iVar2 = pEVar3->t0;
    iVar1 = pEVar3->t1;
    vVar4 = lineage::NegativeLogProbabilityRatio<double>::operator()(&local_1d8,pEVar3->weight);
    vVar5 = lineage::NegativeLogProbabilityRatio<double>::operator()
                      (&local_1d8,(&parameters.biasSpatial)[iVar2 != iVar1]);
    pEVar3->weight = vVar5 + vVar4;
  }
  solution.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  solution.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  solution.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (parameters.bifurcationConstraint != false) {
    lineage::ProblemGraph::ProblemGraph(&problemGraph,&problem);
    fileNamePrefix = &parameters.solutionName;
    std::__cxx11::string::string(local_240,(string *)fileNamePrefix);
    lineage::heuristics::
    applyInitializedHeuristic<lineage::heuristics::LocalPartitionOptimizer<lineage::heuristics::branching::HungarianBranching<lineage::heuristics::PartitionGraph>,lineage::heuristics::branching::MaskedHungarianBranching<lineage::heuristics::PartitionGraph>>,lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,std::allocator<double>>>>
              ((Solution *)&solutionGraph,(heuristics *)&problemGraph,
               (ProblemGraph *)(ulong)parameters.bifurcationConstraint,parameters.terminationCost,
               parameters.birthCost,SUB81(local_240,0),(string *)parameters.maxDistance,in_R9);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
              (&solution.edge_labels,&solutionGraph);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&solutionGraph);
    std::__cxx11::string::~string(local_240);
    lineage::ProblemGraph::~ProblemGraph(&problemGraph);
    lineage::ProblemGraph::ProblemGraph(&problemGraph,&problem);
    lineage::SolutionGraph::SolutionGraph(&solutionGraph,&problemGraph,&solution);
    lineage::SolutionGraph::save(&solutionGraph,fileNamePrefix);
    std::operator+(&local_260,fileNamePrefix,"-lineage-tree.svg");
    lineage::SolutionGraph::saveSVG(&solutionGraph,&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    lineage::SolutionGraph::~SolutionGraph(&solutionGraph);
    lineage::ProblemGraph::~ProblemGraph(&problemGraph);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&solution);
    lineage::Problem::~Problem(&problem);
    Parameters::~Parameters(&parameters);
    return 0;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Disabled bifurcation constraints are not supported.");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

int
main(int argc, char** argv) try {
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName,
                                        parameters.edgesFileName);

    // map edge probabilities to edge cut costs:
    lineage::NegativeLogProbabilityRatio<> func;
    for (auto& e : problem.edges)
        if (e.t0 != e.t1)
            e.weight = func(e.weight) + func(parameters.biasTemporal);
        else
            e.weight = func(e.weight) + func(parameters.biasSpatial);

    // heuristic for initial lineage.
    using Initializer = lineage::heuristics::GreedyLineageAgglomeration<>;

    // global optimizer.
    using BranchingOpt = lineage::heuristics::branching::HungarianBranching<
        lineage::heuristics::PartitionGraph>;

    using LocalBranchingOpt =
        lineage::heuristics::branching::MaskedHungarianBranching<
            lineage::heuristics::PartitionGraph>;
    using HeuristicWithBifurcation =
        lineage::heuristics::LocalPartitionOptimizer<BranchingOpt,
                                                     LocalBranchingOpt>;

    // solve problem
    lineage::Solution solution;
    if (parameters.bifurcationConstraint) {
        solution = lineage::heuristics::applyInitializedHeuristic<
            HeuristicWithBifurcation, Initializer>(
            problem, parameters.terminationCost, parameters.birthCost,
            parameters.bifurcationConstraint, parameters.solutionName,
            parameters.maxDistance);
    } else {
        throw std::runtime_error(
            "Disabled bifurcation constraints are not supported.");
    }

    // save solution:
    lineage::ProblemGraph problemGraph(problem);
    lineage::SolutionGraph solutionGraph(problemGraph, solution);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
} catch (const std::runtime_error& error) {
    std::cerr << "error: " << error.what() << std::endl;
    return 1;
}